

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

double __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG>::Solve
          (BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *this)

{
  pointer pdVar1;
  element_type *peVar2;
  shared_count sVar3;
  ostream *poVar4;
  BGIP_BnB_Node *this_00;
  ulong uVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  string local_68;
  value_type local_48;
  double local_38;
  shared_ptr<BGIP_BnB_Node> local_30;
  
  this->_m_solved = true;
  (*(code *)**(undefined8 **)
              &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>).
               super_BGIP_IncrementalSolverInterface)();
  if (0 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound::Solve() called.",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  ComputeCompleteInformationValues(this);
  ReOrderJointTypes(this,&this->_m_jtIndexMapping);
  if (0 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound Resulting order of joint types: ",
               0x3a);
    PrintTools::SoftPrintVector<unsigned_int>(&local_68,&this->_m_jtIndexMapping);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  local_48.px = (element_type *)0x0;
  local_48.pn.pi_ = (sp_counted_base *)0x0;
  this_00 = (BGIP_BnB_Node *)operator_new(0x40);
  uVar5 = (**(code **)(*(long *)(this->_m_bgip).px + 0x18))();
  BGIP_BnB_Node::BGIP_BnB_Node(this_00,uVar5);
  boost::shared_ptr<BGIP_BnB_Node>::shared_ptr<BGIP_BnB_Node>(&local_30,this_00);
  sVar3.pi_ = local_30.pn.pi_;
  peVar2 = local_30.px;
  local_68._M_string_length = (size_type)local_48.pn.pi_;
  local_68._M_dataplus._M_p = (pointer)local_48.px;
  local_30.px = (element_type *)0x0;
  local_30.pn.pi_ = (sp_counted_base *)0x0;
  local_48.px = peVar2;
  local_48.pn.pi_ = sVar3.pi_;
  boost::detail::shared_count::~shared_count((shared_count *)&local_68._M_string_length);
  boost::detail::shared_count::~shared_count(&local_30.pn);
  uVar7 = 0;
  while( true ) {
    uVar5 = BayesianGameBase::GetNrJointTypes();
    uVar8 = (ulong)uVar7;
    if (uVar5 == uVar8) {
      std::
      priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
      ::push(this->_m_openQueue,&local_48);
      if (3 < this->_m_verbosity) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"BGIP_SolverBranchAndBound ",0x1a);
        BGIP_BnB_Node::SoftPrint_abi_cxx11_();
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_68._M_dataplus._M_p,
                            local_68._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      local_38 = ReSolve(this);
      boost::detail::shared_count::~shared_count(&local_48.pn);
      return local_38;
    }
    pdVar1 = (this->_m_completeInformationValues).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((ulong)((long)(this->_m_completeInformationValues).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar8) break;
    BGIP_BnB_Node::UpdateH(pdVar1[uVar8]);
    uVar7 = uVar7 + 1;
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar8);
  boost::detail::shared_count::~shared_count(&local_48.pn);
  _Unwind_Resume(uVar6);
}

Assistant:

double Solve()
    {
        _m_solved=true;
        this->InitDeadline();
        if(_m_verbosity>=1)
            std::cout << "BGIP_SolverBranchAndBound::Solve() called."<<std::endl;
        // Compute upper bound heuristic values
        ComputeCompleteInformationValues();
        
        // Reorder the joint types
        ReOrderJointTypes(_m_jtIndexMapping); 

        if(_m_verbosity>=1)
            std::cout
                << "BGIP_SolverBranchAndBound Resulting order of joint types: "
                << SoftPrintVector(_m_jtIndexMapping) << std::endl;

        // Initialize root node
        BGIP_BnB_NodePtr root;
        // If we want to update the joint type index mapping during the
        // search, we have to maintain it for each node. Otherwise we can
        // just use the copy in this class.
#if DYNAMIC_JT_INDEX_MAPPING
        if(_m_reComputeJTIndexMapping)
            root = new BGIP_BnB_Node(_m_bgip, _m_maxDepth,
                                     _m_jtIndexMapping);
        else
#endif
            root = BGIP_BnB_NodePtr(new BGIP_BnB_Node(_m_bgip->GetNrAgents()));
        // G is initialized to 0,
        // H is also initialized to 0, so we now *add* the contributions for each joint type
        for(Index jt_bgI=0;jt_bgI!=_m_bgip->GetNrJointTypes();++jt_bgI)
            root->UpdateH(_m_completeInformationValues.at(jt_bgI));

        // push the root node on the queue of open nodes
        _m_openQueue->push(root);

        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound "
                      << root->SoftPrint() << std::endl;

        return(ReSolve());
    }